

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O1

void __thiscall
crnlib::dxt_hc::determine_color_endpoint_codebook_task_etc(dxt_hc *this,uint64 data,void *param_2)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  uint min_new_capacity;
  uint uVar5;
  color_quad_u8 (*pacVar6) [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int c;
  long lVar9;
  byte bVar10;
  int t;
  int iVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  uint p;
  uchar uVar15;
  int iVar16;
  uchar uVar17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  uint8 s;
  ulong uVar21;
  uint uVar22;
  color_cluster *pcVar23;
  bool bVar24;
  float fVar25;
  color_quad_u8 endpoint;
  vector<unsigned_char> selectors;
  params params;
  int scan [3];
  results results;
  int refine [4];
  etc1_optimizer optimizer;
  undefined4 local_20c;
  elemental_vector local_208;
  undefined4 local_1f8;
  undefined2 local_1f4;
  uint local_1f0;
  color_quad<unsigned_char,_int> *local_1e8;
  undefined1 local_1e0;
  undefined8 *local_1d8;
  undefined8 local_1d0;
  undefined1 local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  dxt_hc *local_1b0;
  ulong local_1a8;
  ulong local_1a0;
  ulong local_198;
  ulong local_190;
  ulong local_188;
  undefined8 local_180;
  undefined4 local_178;
  ulong local_170;
  byte abStack_168 [4];
  uint local_164;
  uint local_160;
  void *local_158;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  etc1_optimizer local_138;
  
  local_1c0 = CONCAT44(0,this->m_pTask_pool->m_num_threads + 1);
  local_180 = 0xffffffff;
  local_178 = 1;
  local_148 = 0xfffffffd;
  uStack_144 = 0xfffffffe;
  uStack_140 = 2;
  uStack_13c = 3;
  uVar20 = (ulong)(this->m_color_clusters).m_size;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_1c0;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar20 * data;
  local_1c0 = ((data + 1) * uVar20) / local_1c0;
  if (SUB164(auVar8 / auVar7,0) < (uint)local_1c0) {
    uVar20 = SUB168(auVar8 / auVar7,0) & 0xffffffff;
    local_1c0 = local_1c0 & 0xffffffff;
    local_1b0 = this;
    do {
      pcVar23 = (this->m_color_clusters).m_p;
      if (pcVar23[uVar20].pixels.m_size != 0) {
        pcVar23 = pcVar23 + uVar20;
        local_138.m_sorted_luma[1].m_p = (uint *)0x0;
        local_138.m_sorted_luma[1].m_size = 0;
        local_138.m_sorted_luma[1].m_capacity = 0;
        local_138.m_sorted_luma[0].m_p = (uint *)0x0;
        local_138.m_sorted_luma[0].m_size = 0;
        local_138.m_sorted_luma[0].m_capacity = 0;
        local_138.m_luma.m_p = (unsigned_short *)0x0;
        local_138.m_luma.m_size = 0;
        local_138.m_luma.m_capacity = 0;
        local_138.m_best_solution.m_selectors.m_p = (uchar *)0x0;
        local_138.m_best_solution.m_selectors.m_size = 0;
        local_138.m_best_solution.m_selectors.m_capacity = 0;
        local_138.m_best_solution.m_coords.m_unscaled_color.field_0.field_0.r = '\0';
        local_138.m_best_solution.m_coords._1_8_ = 0;
        local_138.m_best_selectors.m_p = (uchar *)0x0;
        local_138.m_best_selectors.m_size._0_1_ = 0;
        local_138.m_best_selectors._9_7_ = 0;
        local_138.m_selectors.m_p = (uchar *)0x0;
        local_138.m_selectors.m_size = 0;
        local_138.m_selectors.m_capacity = 0;
        local_138.m_best_solution.m_error = 0xffffffffffffffff;
        local_138.m_best_solution.m_valid = false;
        local_138.m_trial_solution.m_coords.m_color4 = false;
        local_138.m_trial_solution.m_coords.m_unscaled_color.field_0 =
             (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
        local_138.m_trial_solution.m_coords.m_inten_table = 0;
        local_138.m_trial_solution.m_selectors.m_p = (uchar *)0x0;
        local_138.m_trial_solution.m_selectors.m_size = 0;
        local_138.m_trial_solution.m_selectors.m_capacity = 0;
        local_138.m_trial_solution.m_error = 0xffffffffffffffff;
        local_138.m_trial_solution.m_valid = false;
        local_138.m_temp_selectors.m_p = (uchar *)0x0;
        local_138.m_temp_selectors.m_size = 0;
        local_138.m_temp_selectors.m_capacity = 0;
        local_138.m_pParams = (params *)0x0;
        local_138.m_pResult = (results *)0x0;
        local_138.m_pSorted_luma_indices = (uint32 *)0x0;
        local_138.m_pSorted_luma = (uint32 *)0x0;
        local_1f8 = 2;
        local_1f4 = 1;
        local_1f0 = 0;
        local_1e8 = (color_quad<unsigned_char,_int> *)0x0;
        local_1e0 = 0;
        local_1d8 = (undefined8 *)
                    &etc1_optimizer::params::clear_optimizer_params()::s_default_scan_delta;
        local_1d0 = 1;
        local_1c8 = 0;
        min_new_capacity = (pcVar23->pixels).m_size;
        local_208.m_p = (void *)0x0;
        local_208.m_size = 0;
        local_208.m_capacity = 0;
        if (min_new_capacity != 0) {
          elemental_vector::increase_capacity
                    (&local_208,min_new_capacity,min_new_capacity == 1,1,(object_mover)0x0,false);
          memset((void *)((local_208._8_8_ & 0xffffffff) + (long)local_208.m_p),0,
                 (ulong)(min_new_capacity - local_208.m_size));
          local_208.m_size = min_new_capacity;
        }
        local_1e8 = (pcVar23->pixels).m_p;
        local_158 = local_208.m_p;
        local_1f0 = (pcVar23->pixels).m_size;
        local_160 = local_1f0;
        etc1_optimizer::init(&local_138,(EVP_PKEY_CTX *)&local_1f8);
        local_1d8 = &local_180;
        local_1d0._0_4_ = 3;
        etc1_optimizer::compute(&local_138);
        if (local_1f0 * 0x177 < local_170) {
          local_1d8 = (undefined8 *)&local_148;
          local_1d0._0_4_ = 4;
          etc1_optimizer::compute(&local_138);
        }
        lVar9 = 0;
        do {
          *(byte *)((long)&local_20c + lVar9) = abStack_168[lVar9] >> 2 | abStack_168[lVar9] * '\b';
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
        local_20c = CONCAT13((char)local_164,(undefined3)local_20c);
        pcVar23->first_endpoint = local_20c;
        bVar10 = (&DAT_001baa90)[(ulong)(local_164 & 0xff) * 2];
        bVar1 = (&DAT_001baa91)[(ulong)(local_164 & 0xff) * 2];
        lVar9 = 0;
        do {
          bVar2 = *(byte *)((long)&local_20c + lVar9);
          uVar17 = bVar2 - bVar1;
          if (bVar2 < bVar1) {
            uVar17 = '\0';
          }
          pcVar23->color_values[0].field_0.c[lVar9] = uVar17;
          uVar17 = bVar2 - bVar10;
          if (bVar2 < bVar10) {
            uVar17 = '\0';
          }
          pcVar23->color_values[1].field_0.c[lVar9] = uVar17;
          uVar17 = bVar10 + bVar2;
          if (CARRY1(bVar10,bVar2)) {
            uVar17 = 0xff;
          }
          uVar15 = bVar2 + bVar1;
          if (CARRY1(bVar2,bVar1)) {
            uVar15 = 0xff;
          }
          pcVar23->color_values[2].field_0.c[lVar9] = uVar17;
          pcVar23->color_values[3].field_0.c[lVar9] = uVar15;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
        lVar9 = 4;
        lVar13 = 0;
        do {
          pcVar23->color_values[lVar13].field_0.field_0.a = 0xff;
          lVar13 = lVar13 + 1;
          lVar9 = lVar9 + -1;
        } while (lVar9 != 0);
        fVar25 = (float)(int)(((uint)pcVar23->color_values[3].field_0.field_0.b * 0x1d2f + 0x8000 +
                               (uint)pcVar23->color_values[3].field_0.field_0.g * 0x9646 +
                               (uint)pcVar23->color_values[3].field_0.field_0.r * 0x4c8b >> 0x10) -
                             ((uint)pcVar23->color_values[0].field_0.field_0.b * 0x1d2f + 0x8000 +
                              (uint)pcVar23->color_values[0].field_0.field_0.g * 0x9646 +
                              (uint)pcVar23->color_values[0].field_0.field_0.r * 0x4c8b >> 0x10)) /
                 100.0;
        if (1.0 <= fVar25) {
          fVar25 = 1.0;
        }
        local_1b8 = uVar20;
        fVar25 = powf(fVar25,2.7);
        if (pcVar23->blocks[0].m_size != 0) {
          bVar3 = this->m_has_subblocks;
          uVar20 = 0;
          do {
            local_188 = uVar20;
            uVar5 = pcVar23->blocks[0].m_p[local_188];
            local_190 = (ulong)uVar5;
            bVar4 = this->m_has_subblocks;
            local_198 = (ulong)bVar4;
            lVar9 = local_190 << (6U - bVar4 & 0x3f);
            pacVar6 = this->m_blocks;
            local_1a8 = (ulong)((this->m_block_weights).m_p[local_190] * fVar25 * 32768.0 *
                               *(float *)(&DAT_001baad0 +
                                         (ulong)((this->m_block_encodings).m_p[local_190] == '\0') *
                                         4));
            local_1a0 = 0xffff;
            if ((uint)local_1a8 < 0xffff) {
              local_1a0 = local_1a8 & 0xffffffff;
            }
            lVar13 = 0;
            uVar20 = 0;
            do {
              uVar22 = 0xffffffff;
              uVar21 = 0;
              uVar14 = 0;
              do {
                iVar16 = (uint)(*pacVar6)[lVar13].field_0.c[lVar9] -
                         (uint)pcVar23->color_values[uVar21].field_0.field_0.r;
                uVar18 = (uint)pcVar23->color_values[uVar21].field_0.field_0.g;
                uVar12 = (uint)pcVar23->color_values[uVar21].field_0.field_0.b;
                if ((this->m_params).m_perceptual == false) {
                  iVar19 = (*pacVar6)[lVar13].field_0.c[lVar9 + 1] - uVar18;
                  iVar11 = (*pacVar6)[lVar13].field_0.c[lVar9 + 2] - uVar12;
                  uVar12 = iVar11 * iVar11 + iVar19 * iVar19 + iVar16 * iVar16;
                }
                else {
                  iVar19 = (*pacVar6)[lVar13].field_0.c[lVar9 + 1] - uVar18;
                  iVar11 = (*pacVar6)[lVar13].field_0.c[lVar9 + 2] - uVar12;
                  uVar12 = iVar11 * iVar11 + iVar19 * iVar19 * 0x19 + iVar16 * iVar16 * 8;
                }
                bVar24 = uVar12 < uVar22;
                if (bVar24) {
                  uVar22 = uVar12;
                }
                uVar14 = uVar14 & 0xff;
                if (bVar24) {
                  uVar14 = uVar21 & 0xffffffff;
                }
                uVar21 = uVar21 + 1;
              } while (uVar21 != 4);
              uVar20 = (ulong)((uint)uVar14 & 0xff | (int)uVar20 << 2);
              lVar13 = lVar13 + 1;
            } while (lVar13 != (ulong)(bVar3 ^ 1) * 8 + 8);
            uVar14 = local_1a0;
            if ((uint)local_1a8 == 0) {
              uVar14 = 1;
            }
            bVar10 = bVar4 << 4 | 0x20;
            if ((uVar5 & 1) != 0) {
              bVar10 = 0x20;
            }
            local_1b0->m_block_selectors[0].m_p[local_190] = uVar14 | uVar20 << (bVar10 & 0x3f);
            uVar20 = local_188 + 1;
            this = local_1b0;
          } while (local_188 + 1 < (ulong)pcVar23->blocks[0].m_size);
        }
        if (local_208.m_p != (void *)0x0) {
          crnlib_free(local_208.m_p);
        }
        etc1_optimizer::~etc1_optimizer(&local_138);
        uVar20 = local_1b8;
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 < local_1c0);
  }
  return;
}

Assistant:

void dxt_hc::determine_color_endpoint_codebook_task_etc(uint64 data, void*) {
  uint num_tasks = m_pTask_pool->get_num_threads() + 1;
  uint8 delta[8][2] = { {2, 8}, {5, 17}, {9, 29}, {13, 42}, {18, 60}, {24, 80}, {33, 106}, {47, 183} };
  int scan[] = {-1, 0, 1};
  int refine[] = {-3, -2, 2, 3};
  for (uint iCluster = m_color_clusters.size() * data / num_tasks, iEnd = m_color_clusters.size() * (data + 1) / num_tasks; iCluster < iEnd; iCluster++) {
    color_cluster& cluster = m_color_clusters[iCluster];
    if (cluster.pixels.size()) {
      etc1_optimizer optimizer;
      etc1_optimizer::params params;
      params.m_use_color4 = false;
      params.m_constrain_against_base_color5 = false;
      etc1_optimizer::results results;
      crnlib::vector<uint8> selectors(cluster.pixels.size());
      params.m_pSrc_pixels = cluster.pixels.get_ptr();
      results.m_pSelectors = selectors.get_ptr();
      results.m_n = params.m_num_src_pixels = cluster.pixels.size();
      optimizer.init(params, results);
      params.m_pScan_deltas = scan;
      params.m_scan_delta_size = sizeof(scan) / sizeof(*scan);
      optimizer.compute();
      if (results.m_error > 375 * params.m_num_src_pixels) {
        params.m_pScan_deltas = refine;
        params.m_scan_delta_size = sizeof(refine) / sizeof(*refine);
        optimizer.compute();
      }
      color_quad_u8 endpoint;
      for (int c = 0; c < 3; c++)
        endpoint.c[c] = results.m_block_color_unscaled.c[c] << 3 | results.m_block_color_unscaled.c[c] >> 2;
      endpoint.c[3] = results.m_block_inten_table;
      cluster.first_endpoint = endpoint.m_u32;
      for (uint8 d0 = delta[endpoint.c[3]][0], d1 = delta[endpoint.c[3]][1], c = 0; c < 3; c++) {
        uint8 q = endpoint.c[c];
        cluster.color_values[0].c[c] = q <= d1 ? 0 : q - d1;
        cluster.color_values[1].c[c] = q <= d0 ? 0 : q - d0;
        cluster.color_values[2].c[c] = q >= 255 - d0 ? 255 : q + d0;
        cluster.color_values[3].c[c] = q >= 255 - d1 ? 255 : q + d1;
      }
      for (int t = 0; t < 4; t++)
        cluster.color_values[t].c[3] = 0xFF;
      float endpoint_weight = powf(math::minimum((cluster.color_values[3].get_luma() - cluster.color_values[0].get_luma()) / 100.0f, 1.0f), 2.7f);

      crnlib::vector<uint>& blocks = cluster.blocks[cColor];
      uint blockSize = m_has_subblocks ? 8 : 16;
      for (uint i = 0; i < blocks.size(); i++) {
        uint b = blocks[i];
        color_quad_u8* pixels = m_has_subblocks ? ((color_quad_u8(*)[8])m_blocks)[b] : m_blocks[b];
        uint weight = (uint)(math::clamp<uint>(0x8000 * endpoint_weight * m_block_weights[b] * (m_block_encodings[b] ? 0.972f : 1.0f), 1, 0xFFFF));
        uint32 selector = 0;
        for (uint p = 0; p < blockSize; p++) {
          uint error_best = cUINT32_MAX;
          uint8 s_best = 0;
          for (uint8 s = 0; s < 4; s++) {
            uint error = color::color_distance(m_params.m_perceptual, pixels[p], cluster.color_values[s], false);
            if (error < error_best) {
              s_best = s;
              error_best = error;
            }
          }
          selector = selector << 2 | s_best;
        }
        m_block_selectors[cColor][b] = (uint64)selector << (!m_has_subblocks || (b & 1) ? 32 : 48) | weight;
      }
    }
  }
}